

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O1

uint32_t __thiscall
icu_63::CollationDataBuilder::copyFromBaseCE32
          (CollationDataBuilder *this,UChar32 c,uint32_t ce32,UBool withContext,
          UErrorCode *errorCode)

{
  UChar UVar1;
  UChar *pUVar2;
  UBool UVar3;
  uint32_t uVar4;
  int32_t iVar5;
  ConditionalCE32 *pCVar6;
  undefined4 uVar7;
  ulong uVar8;
  bool bVar9;
  char16_t local_15a;
  ConstChar16Ptr local_158;
  UChar *local_150;
  UnicodeString local_140;
  ConditionalCE32 local_100;
  undefined1 local_a8 [40];
  UnicodeString local_80;
  uint local_3c;
  
LAB_0022367f:
  if (U_ZERO_ERROR < *errorCode) {
    return 0;
  }
  if ((~ce32 & 0xc0) != 0) {
    return ce32;
  }
  switch(ce32 & 0xf) {
  case 5:
    uVar4 = encodeExpansion32(this,(int32_t *)
                                   ((ulong)(ce32 >> 0xb & 0xfffffffc) + (long)this->base->ce32s),
                              ce32 >> 8 & 0x1f,errorCode);
    return uVar4;
  case 6:
    uVar4 = encodeExpansion(this,(int64_t *)
                                 ((ulong)(ce32 >> 10 & 0xfffffff8) + (long)this->base->ces),
                            ce32 >> 8 & 0x1f,errorCode);
    return uVar4;
  default:
    goto switchD_002236b0_caseD_7;
  case 8:
    break;
  case 9:
    if (withContext != '\0') {
      pCVar6 = (ConditionalCE32 *)local_a8;
      local_a8._8_8_ = &PTR__UnicodeString_0048be70;
      local_a8._16_2_ = 2;
      local_80.fUnion._24_4_ = 0;
      local_80.fUnion._28_4_ = 1;
      local_80.fUnion._32_4_ = 1;
      local_80.fUnion._36_4_ = -1;
      icu_63::UnicodeString::UnicodeString((UnicodeString *)&local_100,L'\0');
      copyContractionsFromBaseCE32
                (this,(UnicodeString *)&local_100,c,ce32,(ConditionalCE32 *)local_a8,errorCode);
      uVar7 = local_80.fUnion._36_4_;
      UnicodeSet::add(&this->contextChars,c);
      ce32 = uVar7 << 0xd | 199;
      icu_63::UnicodeString::~UnicodeString((UnicodeString *)&local_100);
      goto LAB_00223a7b;
    }
    pUVar2 = this->base->contexts;
    ce32 = CONCAT22(pUVar2[ce32 >> 0xd],pUVar2[(ulong)(ce32 >> 0xd) + 1]);
    withContext = '\0';
    goto LAB_0022367f;
  case 0xc:
    *errorCode = U_UNSUPPORTED_ERROR;
    return ce32;
  case 0xe:
    uVar4 = Collation::getThreeBytePrimaryForOffsetData(c,this->base->ces[ce32 >> 0xd]);
    return uVar4 | 0xc1;
  case 0xf:
    uVar4 = Collation::unassignedPrimaryFromCodePoint(c);
    uVar4 = encodeOneCE(this,((ulong)uVar4 << 0x20) + 0x5000500,errorCode);
    return uVar4;
  }
  pUVar2 = this->base->contexts;
  uVar8 = (ulong)(ce32 >> 0xd);
  UVar1 = pUVar2[uVar8 + 1];
  ce32 = CONCAT22(pUVar2[uVar8],UVar1);
  bVar9 = withContext != '\0';
  withContext = '\0';
  if (bVar9) goto LAB_0022386a;
  goto LAB_0022367f;
LAB_0022386a:
  local_100.context.super_Replaceable.super_UObject._vptr_UObject =
       (UObject)&PTR__UnicodeString_0048be70;
  local_100.context.fUnion.fStackFields.fLengthAndFlags = 2;
  local_100.ce32 = 0;
  local_100.defaultCE32 = 1;
  local_100.builtCE32 = 1;
  local_100.next = -1;
  icu_63::UnicodeString::UnicodeString(&local_140,L'\0');
  if ((UVar1 & 0xcfU) == 0xc9) {
    iVar5 = copyContractionsFromBaseCE32(this,&local_140,c,ce32,&local_100,errorCode);
  }
  else {
    uVar4 = copyFromBaseCE32(this,c,ce32,'\x01',errorCode);
    iVar5 = addConditionalCE32(this,&local_140,uVar4,errorCode);
    local_100.next = iVar5;
  }
  ce32 = 0;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    pCVar6 = (ConditionalCE32 *)UVector::elementAt(&this->conditionalCE32s,iVar5);
    local_158.p_ = pUVar2 + uVar8 + 2;
    UCharsTrie::Iterator::Iterator((Iterator *)local_a8,&local_158,0,errorCode);
    local_150 = local_158.p_;
    while (UVar3 = UCharsTrie::Iterator::next((Iterator *)local_a8,errorCode), UVar3 != '\0') {
      icu_63::UnicodeString::operator=(&local_140,&local_80);
      uVar7 = local_140.fUnion.fFields.fLength;
      if (-1 < local_140.fUnion.fStackFields.fLengthAndFlags) {
        uVar7 = (int)local_140.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      icu_63::UnicodeString::doReverse(&local_140,0,uVar7);
      if ((short)local_140.fUnion._0_2_ < 0) {
        local_15a = local_140.fUnion.fStackFields.fBuffer[1];
      }
      else {
        local_15a = (char16_t)((uint)(int)local_140.fUnion.fStackFields.fLengthAndFlags >> 5);
      }
      icu_63::UnicodeString::doReplace(&local_140,0,0,&local_15a,0,1);
      if ((local_3c & 0xcf) == 0xc9) {
        iVar5 = copyContractionsFromBaseCE32(this,&local_140,c,local_3c,pCVar6,errorCode);
      }
      else {
        uVar4 = copyFromBaseCE32(this,c,local_3c,'\x01',errorCode);
        iVar5 = addConditionalCE32(this,&local_140,uVar4,errorCode);
        pCVar6->next = iVar5;
      }
      if (U_ZERO_ERROR < *errorCode) {
        ce32 = 0;
        goto LAB_00223a5f;
      }
      pCVar6 = (ConditionalCE32 *)UVector::elementAt(&this->conditionalCE32s,iVar5);
    }
    iVar5 = local_100.next;
    UnicodeSet::add(&this->contextChars,c);
    ce32 = iVar5 << 0xd | 199;
LAB_00223a5f:
    UCharsTrie::Iterator::~Iterator((Iterator *)local_a8);
  }
  icu_63::UnicodeString::~UnicodeString(&local_140);
  pCVar6 = &local_100;
LAB_00223a7b:
  icu_63::UnicodeString::~UnicodeString(&pCVar6->context);
switchD_002236b0_caseD_7:
  return ce32;
}

Assistant:

uint32_t
CollationDataBuilder::copyFromBaseCE32(UChar32 c, uint32_t ce32, UBool withContext,
                                       UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return 0; }
    if(!Collation::isSpecialCE32(ce32)) { return ce32; }
    switch(Collation::tagFromCE32(ce32)) {
    case Collation::LONG_PRIMARY_TAG:
    case Collation::LONG_SECONDARY_TAG:
    case Collation::LATIN_EXPANSION_TAG:
        // copy as is
        break;
    case Collation::EXPANSION32_TAG: {
        const uint32_t *baseCE32s = base->ce32s + Collation::indexFromCE32(ce32);
        int32_t length = Collation::lengthFromCE32(ce32);
        ce32 = encodeExpansion32(
            reinterpret_cast<const int32_t *>(baseCE32s), length, errorCode);
        break;
    }
    case Collation::EXPANSION_TAG: {
        const int64_t *baseCEs = base->ces + Collation::indexFromCE32(ce32);
        int32_t length = Collation::lengthFromCE32(ce32);
        ce32 = encodeExpansion(baseCEs, length, errorCode);
        break;
    }
    case Collation::PREFIX_TAG: {
        // Flatten prefixes and nested suffixes (contractions)
        // into a linear list of ConditionalCE32.
        const UChar *p = base->contexts + Collation::indexFromCE32(ce32);
        ce32 = CollationData::readCE32(p);  // Default if no prefix match.
        if(!withContext) {
            return copyFromBaseCE32(c, ce32, FALSE, errorCode);
        }
        ConditionalCE32 head;
        UnicodeString context((UChar)0);
        int32_t index;
        if(Collation::isContractionCE32(ce32)) {
            index = copyContractionsFromBaseCE32(context, c, ce32, &head, errorCode);
        } else {
            ce32 = copyFromBaseCE32(c, ce32, TRUE, errorCode);
            head.next = index = addConditionalCE32(context, ce32, errorCode);
        }
        if(U_FAILURE(errorCode)) { return 0; }
        ConditionalCE32 *cond = getConditionalCE32(index);  // the last ConditionalCE32 so far
        UCharsTrie::Iterator prefixes(p + 2, 0, errorCode);
        while(prefixes.next(errorCode)) {
            context = prefixes.getString();
            context.reverse();
            context.insert(0, (UChar)context.length());
            ce32 = (uint32_t)prefixes.getValue();
            if(Collation::isContractionCE32(ce32)) {
                index = copyContractionsFromBaseCE32(context, c, ce32, cond, errorCode);
            } else {
                ce32 = copyFromBaseCE32(c, ce32, TRUE, errorCode);
                cond->next = index = addConditionalCE32(context, ce32, errorCode);
            }
            if(U_FAILURE(errorCode)) { return 0; }
            cond = getConditionalCE32(index);
        }
        ce32 = makeBuilderContextCE32(head.next);
        contextChars.add(c);
        break;
    }
    case Collation::CONTRACTION_TAG: {
        if(!withContext) {
            const UChar *p = base->contexts + Collation::indexFromCE32(ce32);
            ce32 = CollationData::readCE32(p);  // Default if no suffix match.
            return copyFromBaseCE32(c, ce32, FALSE, errorCode);
        }
        ConditionalCE32 head;
        UnicodeString context((UChar)0);
        copyContractionsFromBaseCE32(context, c, ce32, &head, errorCode);
        ce32 = makeBuilderContextCE32(head.next);
        contextChars.add(c);
        break;
    }
    case Collation::HANGUL_TAG:
        errorCode = U_UNSUPPORTED_ERROR;  // We forbid tailoring of Hangul syllables.
        break;
    case Collation::OFFSET_TAG:
        ce32 = getCE32FromOffsetCE32(TRUE, c, ce32);
        break;
    case Collation::IMPLICIT_TAG:
        ce32 = encodeOneCE(Collation::unassignedCEFromCodePoint(c), errorCode);
        break;
    default:
        U_ASSERT(FALSE);  // require ce32 == base->getFinalCE32(ce32)
        break;
    }
    return ce32;
}